

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::writeValue(StyledWriter *this,Value *value)

{
  bool bVar1;
  ValueType VVar2;
  Json *pJVar3;
  Value *pVVar4;
  uint length;
  bool value_00;
  LargestInt value_01;
  LargestUInt value_02;
  char *value_03;
  string *key;
  double value_04;
  string sStack_78;
  allocator local_51;
  char *end;
  char *str;
  string *local_40;
  
  pVVar4 = value;
  VVar2 = Value::type(value);
  length = 0x1522d0;
  switch(VVar2) {
  case nullValue:
    std::__cxx11::string::string((string *)&sStack_78,"null",(allocator *)&str);
    pushValue(this,&sStack_78);
    break;
  case intValue:
  case int64Value:
    pJVar3 = (Json *)Value::asLargestInt(value);
    valueToString_abi_cxx11_(&sStack_78,pJVar3,value_01);
    pushValue(this,&sStack_78);
    break;
  case uintValue:
    pJVar3 = (Json *)Value::asLargestUInt(value);
    valueToString_abi_cxx11_(&sStack_78,pJVar3,value_02);
    pushValue(this,&sStack_78);
    break;
  case realValue:
    value_04 = Value::asDouble(value);
    valueToString_abi_cxx11_(&sStack_78,(Json *)pVVar4,value_04);
    pushValue(this,&sStack_78);
    break;
  case stringValue:
    bVar1 = Value::getString(value,&str,&end);
    if (bVar1) {
      valueToQuotedStringN_abi_cxx11_
                (&sStack_78,(Json *)str,(char *)(ulong)(uint)((int)end - (int)str),length);
      pushValue(this,&sStack_78);
    }
    else {
      std::__cxx11::string::string((string *)&sStack_78,"",&local_51);
      pushValue(this,&sStack_78);
    }
    break;
  case booleanValue:
    bVar1 = Value::asBool(value);
    valueToString_abi_cxx11_(&sStack_78,(Json *)(ulong)bVar1,value_00);
    pushValue(this,&sStack_78);
    break;
  case arrayValue:
    writeArrayValue(this,value);
    return;
  case objectValue:
    Value::getMemberNames_abi_cxx11_((Members *)&str,value);
    if ((string *)str == local_40) {
      std::__cxx11::string::string((string *)&sStack_78,"{}",(allocator *)&end);
      pushValue(this,&sStack_78);
    }
    else {
      std::__cxx11::string::string((string *)&sStack_78,"{",(allocator *)&end);
      writeWithIndent(this,&sStack_78);
      std::__cxx11::string::~string((string *)&sStack_78);
      indent(this);
      key = (string *)str;
      while( true ) {
        pVVar4 = Value::operator[](value,key);
        writeCommentBeforeValue(this,pVVar4);
        valueToQuotedString_abi_cxx11_(&sStack_78,(Json *)(key->_M_dataplus)._M_p,value_03);
        writeWithIndent(this,&sStack_78);
        std::__cxx11::string::~string((string *)&sStack_78);
        std::__cxx11::string::append((char *)&this->document_);
        writeValue(this,pVVar4);
        key = key + 1;
        if (key == local_40) break;
        std::__cxx11::string::push_back((char)&this->document_);
        writeCommentAfterValueOnSameLine(this,pVVar4);
      }
      writeCommentAfterValueOnSameLine(this,pVVar4);
      unindent(this);
      std::__cxx11::string::string((string *)&sStack_78,"}",(allocator *)&end);
      writeWithIndent(this,&sStack_78);
    }
    std::__cxx11::string::~string((string *)&sStack_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&str);
  default:
    goto switchD_001481a3_default;
  }
  std::__cxx11::string::~string((string *)&sStack_78);
switchD_001481a3_default:
  return;
}

Assistant:

void StyledWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    pushValue("null");
    break;
#if defined(JSON_HAS_INT64)
  case int64Value:
#endif
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble()));
    break;
  case stringValue:
  {
    // Is NULL possible for value.string_?
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok) pushValue(valueToQuotedStringN(str, static_cast<unsigned>(end-str)));
    else pushValue("");
    break;
  }
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      Value::Members::iterator it = members.begin();
      for (;;) {
        const std::string& name = *it;
        const Value& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(valueToQuotedString(name.c_str()));
        document_ += " : ";
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ',';
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}